

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindEQ(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
                   BpTree<int> *this,int k)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Addr Cp;
  IndexNode<int> C;
  Addr local_98;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&local_90,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar4 = FindFirstKey(this,k,&local_98);
  FindNode(this,local_98,&local_90);
  if (uVar4 == 0xffffffff) {
LAB_00129d17:
    if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
LAB_00129c36:
  uVar7 = (ulong)(int)uVar4;
  do {
    uVar5 = this->N - 1;
    uVar8 = (ulong)uVar5;
    if ((int)uVar4 < (int)uVar5) {
      cVar3 = local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      uVar10 = (ulong)uVar4;
      lVar11 = uVar7 * 8;
      for (uVar2 = uVar7;
          (cVar3 == '1' &&
          (uVar10 = uVar2,
          local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2] == k)); uVar2 = uVar2 + 1) {
        std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
        _M_insert_unique<Addr_const&>
                  ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
                   __return_storage_ptr__,
                   (Addr *)((long)&(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar11));
        uVar10 = uVar2 + 1;
        uVar8 = (long)this->N - 1;
        if ((long)uVar8 <= (long)uVar10) break;
        lVar11 = lVar11 + 8;
        cVar3 = local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2 + 1];
      }
    }
    else {
      uVar10 = (ulong)uVar4;
    }
    iVar9 = (int)uVar10;
    iVar6 = (int)uVar8;
    if (((iVar9 == iVar6) ||
        (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[iVar9] == '0')) &&
       (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar6].FileOff == -1)) goto LAB_00129d17;
    if ((iVar9 == iVar6) ||
       (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar9] == '0')) break;
    if (local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar9] != k) goto LAB_00129d17;
  } while( true );
  uVar4 = 0;
  FindNode(this,local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                super__Vector_impl_data._M_start[iVar6],&local_90);
  goto LAB_00129c36;
}

Assistant:

set<Addr> BpTree<K>::FindEQ(K k) {
	IndexNode<K> C(N);
	Addr Cp;
	int i;
	set<Addr> ret;
	int pos = this->FindFirstKey(k, Cp);
	this->FindNode(Cp, C);			//C.k[pos]�ǵ�һ����ֵΪk�ĵط�
	if (pos == -1)
		return ret;					//�Ҳ����ü�ֵ�����ؿ�����
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] == k; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;									//��ͷ��
		}
		else if (i == N - 1 || C.v[i] == '0') {		//��Ҷ���������һ�����
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
		else if (C.k[i] != k) {
			break;									//�ҵ���һ���������������λ��
		}
	}
	return ret;
}